

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

BuildPreset * __thiscall
cmake::FindPresetForWorkflow<cmCMakePresetsGraph::BuildPreset>
          (cmake *this,static_string_view type,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
          *presets,WorkflowStep *step)

{
  const_iterator cVar1;
  string *psVar2;
  char *pcVar3;
  string *__k;
  size_t sVar4;
  char local_b1;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  pcVar3 = type.super_string_view._M_str;
  sVar4 = type.super_string_view._M_len;
  __k = &step->PresetName;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
          ::find(&presets->_M_t,__k);
  local_90.View_._M_len = sVar4;
  local_90.View_._M_str = pcVar3;
  if ((_Rb_tree_header *)cVar1._M_node == &(presets->_M_t)._M_impl.super__Rb_tree_header) {
    local_60.View_._M_len = 8;
    local_60.View_._M_str = "No such ";
    psVar2 = GetHomeDirectory_abi_cxx11_(this);
    local_b1 = '\"';
    cmStrCat<char[12],std::__cxx11::string,char[4],std::__cxx11::string,char>
              (&local_b0,&local_60,&local_90,(char (*) [12])0x6476ae,psVar2,(char (*) [4])0x67336c,
               __k,&local_b1);
    cmSystemTools::Error(&local_b0);
  }
  else if ((char)cVar1._M_node[4]._M_color == _S_black) {
    local_60.View_._M_len = 0x12;
    local_60.View_._M_str = "Cannot use hidden ";
    psVar2 = GetHomeDirectory_abi_cxx11_(this);
    local_b1 = '\"';
    cmStrCat<char[12],std::__cxx11::string,char[4],std::__cxx11::string,char>
              (&local_b0,&local_60,&local_90,(char (*) [12])0x6476ae,psVar2,(char (*) [4])0x67336c,
               __k,&local_b1);
    cmSystemTools::Error(&local_b0);
  }
  else if (*(char *)&cVar1._M_node[0x18]._M_left == '\0') {
    local_60.View_._M_len = 0x13;
    local_60.View_._M_str = "Could not evaluate ";
    cmStrCat<char[10],std::__cxx11::string,char[27]>
              (&local_b0,&local_60,&local_90,(char (*) [10])0x646681,__k,
               (char (*) [27])"\": Invalid macro expansion");
    cmSystemTools::Error(&local_b0);
  }
  else {
    if (*(char *)&cVar1._M_node[0x12]._M_parent != '\0') {
      return (BuildPreset *)&cVar1._M_node[0xd]._M_parent;
    }
    local_60.View_._M_len = 0x14;
    local_60.View_._M_str = "Cannot use disabled ";
    psVar2 = GetHomeDirectory_abi_cxx11_(this);
    local_b1 = '\"';
    cmStrCat<char[12],std::__cxx11::string,char[4],std::__cxx11::string,char>
              (&local_b0,&local_60,&local_90,(char (*) [12])0x6476ae,psVar2,(char (*) [4])0x67336c,
               __k,&local_b1);
    cmSystemTools::Error(&local_b0);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  return (BuildPreset *)0x0;
}

Assistant:

const T* cmake::FindPresetForWorkflow(
  cm::static_string_view type,
  const std::map<std::string, cmCMakePresetsGraph::PresetPair<T>>& presets,
  const cmCMakePresetsGraph::WorkflowPreset::WorkflowStep& step)
{
  auto it = presets.find(step.PresetName);
  if (it == presets.end()) {
    cmSystemTools::Error(cmStrCat("No such ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (it->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (!it->second.Expanded) {
    cmSystemTools::Error(cmStrCat("Could not evaluate ", type, " preset \"",
                                  step.PresetName,
                                  "\": Invalid macro expansion"));
    return nullptr;
  }

  if (!it->second.Expanded->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  return &*it->second.Expanded;
}